

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::
dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
::disp_data_source_t::distribute_value_for_priority
          (disp_data_source_t *this,mbox_t *mbox,priority_t priority,size_t quote,
          size_t agents_count,size_t demands_count)

{
  ostream *poVar1;
  prefix_t prefix;
  ostringstream ss;
  size_t local_200;
  size_t local_1f8;
  size_t local_1f0;
  suffix_t local_1e8 [4];
  prefix_t local_1c8;
  ostringstream local_198 [376];
  
  local_200 = demands_count;
  local_1f8 = agents_count;
  local_1f0 = quote;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,(this->m_base_prefix).m_value);
  poVar1 = std::operator<<(poVar1,"/p");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  stats::prefix_t::prefix_t(&local_1c8,local_1e8[0].m_value);
  std::__cxx11::string::~string((string *)local_1e8);
  local_1e8[0] = stats::suffixes::demand_quote();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long&>
            (mbox,&local_1c8,local_1e8,&local_1f0);
  local_1e8[0] = stats::suffixes::agent_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long&>
            (mbox,&local_1c8,local_1e8,&local_1f8);
  local_1e8[0] = stats::suffixes::work_thread_queue_size();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long&>
            (mbox,&local_1c8,local_1e8,&local_200);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void
				distribute_value_for_priority(
					const mbox_t & mbox,
					priority_t priority,
					std::size_t quote,
					std::size_t agents_count,
					std::size_t demands_count )
					{
						std::ostringstream ss;
						ss << m_base_prefix.c_str() << "/p" << to_size_t(priority);

						const stats::prefix_t prefix{ ss.str() };

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::demand_quote(),
								quote );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::agent_count(),
								agents_count );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::work_thread_queue_size(),
								demands_count );
					}